

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text-buffer.cc
# Opt level: O0

bool __thiscall TextBuffer::Layer::is_modified(Layer *this,Layer *base_layer)

{
  uint32_t uVar1;
  uint32_t uVar2;
  anon_class_24_3_34d1d317 local_50;
  Point local_38;
  Point local_30;
  uint32_t local_28;
  bool local_21;
  uint32_t start_offset;
  bool result;
  Layer *base_layer_local;
  Layer *this_local;
  
  _start_offset = base_layer;
  base_layer_local = this;
  uVar1 = size(this);
  uVar2 = size(_start_offset);
  if (uVar1 == uVar2) {
    local_21 = false;
    local_28 = 0;
    Point::Point(&local_30);
    local_38 = extent(this);
    local_50.base_layer = (Layer **)&start_offset;
    local_50.start_offset = &local_28;
    local_50.result = &local_21;
    for_each_chunk_in_range<TextBuffer::Layer::is_modified(TextBuffer::Layer_const*)::_lambda(TextSlice)_1_>
              (this,local_30,local_38,&local_50,false);
    this_local._7_1_ = (bool)(local_21 & 1);
  }
  else {
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool is_modified(const Layer *base_layer) {
    if (size() != base_layer->size()) return true;

    bool result = false;
    uint32_t start_offset = 0;
    for_each_chunk_in_range(Point(), extent(), [&](TextSlice chunk) {
      if (chunk.text == &(*base_layer->text) ||
          equal(chunk.begin(), chunk.end(), base_layer->text->begin() + start_offset)) {
        start_offset += chunk.size();
        return false;
      }
      result = true;
      return true;
    });

    return result;
  }